

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O0

EstimatedBlockSize
duckdb_zstd::ZSTD_estimateSubBlockSize
          (BYTE *literals,size_t litSize,BYTE *ofCodeTable,BYTE *llCodeTable,BYTE *mlCodeTable,
          size_t nbSeq,ZSTD_entropyCTables_t *entropy,ZSTD_entropyCTablesMetadata_t *entropyMetadata
          ,void *workspace,size_t wkspSize,int writeLitEntropy,int writeSeqEntropy)

{
  EstimatedBlockSize EVar1;
  BYTE *mlCodeTable_00;
  size_t sVar2;
  void *in_RCX;
  ZSTD_fseCTablesMetadata_t *in_RDX;
  BYTE *unaff_RBX;
  ZSTD_fseCTables_t *in_RSI;
  size_t in_RDI;
  size_t in_R8;
  int unaff_retaddr;
  void *in_stack_00000010;
  size_t in_stack_00000018;
  EstimatedBlockSize ebs;
  BYTE *in_stack_ffffffffffffffe8;
  BYTE *in_stack_fffffffffffffff0;
  
  mlCodeTable_00 =
       (BYTE *)ZSTD_estimateSubBlockSize_literal
                         (in_stack_ffffffffffffffe8,in_RDI,(ZSTD_hufCTables_t *)in_RSI,
                          (ZSTD_hufCTablesMetadata_t *)in_RDX,in_RCX,in_R8,unaff_retaddr);
  sVar2 = ZSTD_estimateSubBlockSize_sequences
                    (unaff_RBX,in_stack_fffffffffffffff0,mlCodeTable_00,in_RDI,in_RSI,in_RDX,
                     in_stack_00000010,in_stack_00000018,(int)nbSeq);
  EVar1.estBlockSize = (size_t)(mlCodeTable_00 + sVar2 + 3);
  EVar1.estLitSize = (size_t)mlCodeTable_00;
  return EVar1;
}

Assistant:

static EstimatedBlockSize ZSTD_estimateSubBlockSize(const BYTE* literals, size_t litSize,
                                        const BYTE* ofCodeTable,
                                        const BYTE* llCodeTable,
                                        const BYTE* mlCodeTable,
                                        size_t nbSeq,
                                        const ZSTD_entropyCTables_t* entropy,
                                        const ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                        void* workspace, size_t wkspSize,
                                        int writeLitEntropy, int writeSeqEntropy)
{
    EstimatedBlockSize ebs;
    ebs.estLitSize = ZSTD_estimateSubBlockSize_literal(literals, litSize,
                                                        &entropy->huf, &entropyMetadata->hufMetadata,
                                                        workspace, wkspSize, writeLitEntropy);
    ebs.estBlockSize = ZSTD_estimateSubBlockSize_sequences(ofCodeTable, llCodeTable, mlCodeTable,
                                                         nbSeq, &entropy->fse, &entropyMetadata->fseMetadata,
                                                         workspace, wkspSize, writeSeqEntropy);
    ebs.estBlockSize += ebs.estLitSize + ZSTD_blockHeaderSize;
    return ebs;
}